

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall soplex::CLUFactor<double>::initFactorRings(CLUFactor<double> *this)

{
  Pring **p;
  Pring **p_00;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  pointer pdVar5;
  int *piVar6;
  Pring *pPVar7;
  Pring *pPVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Pring *pPVar12;
  long lVar13;
  Pring *pPVar14;
  Pring *pPVar15;
  long lVar16;
  
  piVar1 = (this->row).perm;
  piVar2 = (this->col).perm;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_col,this->thedim + 1);
  p = &(this->temp).pivot_colNZ;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(p,this->thedim + 1);
  spx_alloc<soplex::CLUFactor<double>::Pring*>(&(this->temp).pivot_row,this->thedim + 1);
  p_00 = &(this->temp).pivot_rowNZ;
  spx_alloc<soplex::CLUFactor<double>::Pring*>(p_00,this->thedim + 1);
  iVar9 = this->thedim;
  uVar10 = iVar9 - (this->temp).stage;
  if (-1 < (int)uVar10) {
    iVar11 = uVar10 + 1;
    pPVar14 = *p_00 + uVar10;
    pPVar12 = *p + uVar10;
    do {
      pPVar12->next = pPVar12;
      pPVar12->prev = pPVar12;
      pPVar14->next = pPVar14;
      pPVar14->prev = pPVar14;
      iVar11 = iVar11 + -1;
      pPVar14 = pPVar14 + -1;
      pPVar12 = pPVar12 + -1;
    } while (0 < iVar11);
  }
  if (0 < iVar9) {
    piVar3 = (this->u).row.len;
    piVar4 = (this->temp).s_mark;
    pPVar12 = (this->temp).pivot_rowNZ;
    pPVar14 = (this->temp).pivot_row;
    pdVar5 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->temp).s_cact;
    pPVar7 = (this->temp).pivot_colNZ;
    pPVar15 = (this->temp).pivot_col;
    lVar16 = 0;
    do {
      if (piVar1[lVar16] < 0) {
        lVar13 = (long)piVar3[lVar16];
        if (lVar13 < 1) goto LAB_002000d4;
        pPVar8 = pPVar12[lVar13].next;
        pPVar14->next = pPVar8;
        pPVar8->prev = pPVar14;
        pPVar14->prev = pPVar12 + lVar13;
        pPVar12[lVar13].next = pPVar14;
        pPVar14->idx = (int)lVar16;
        pdVar5[lVar16] = -1.0;
      }
      if (piVar2[lVar16] < 0) {
        lVar13 = (long)piVar6[lVar16];
        if (lVar13 < 1) {
LAB_002000d4:
          this->stat = SINGULAR;
          return;
        }
        pPVar8 = pPVar7[lVar13].next;
        pPVar15->next = pPVar8;
        pPVar8->prev = pPVar15;
        pPVar15->prev = pPVar7 + lVar13;
        pPVar7[lVar13].next = pPVar15;
        pPVar15->idx = (int)lVar16;
        piVar4[lVar16] = 0;
        iVar9 = this->thedim;
      }
      lVar16 = lVar16 + 1;
      pPVar15 = pPVar15 + 1;
      pPVar14 = pPVar14 + 1;
    } while (lVar16 < iVar9);
  }
  return;
}

Assistant:

void CLUFactor<R>::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactor<R>::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}